

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O3

cmListFileContext * __thiscall cmListFileBacktrace::Top(cmListFileBacktrace *this)

{
  cmListFileContext *local_10;
  
  if (this->Cur != (Entry *)0x0) {
    return &this->Cur->super_cmListFileContext;
  }
  if (Top()::empty != '\0') {
    return &Top::empty;
  }
  Top();
  return local_10;
}

Assistant:

cmListFileContext const& cmListFileBacktrace::Top() const
{
  if (this->Cur) {
    return *this->Cur;
  }
  static cmListFileContext const empty;
  return empty;
}